

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::makeConnections(CommonCore *this,string *file)

{
  ConfigType CVar1;
  string_view in_stack_00000010;
  ConfigType type;
  string *in_stack_00000f48;
  CommonCore *in_stack_00000f50;
  string *in_stack_00001198;
  CommonCore *in_stack_000011a0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  CVar1 = fileops::getConfigType(in_stack_00000010);
  if (CVar1 < TOML_STRING) {
    fileops::makeConnectionsJson<helics::CommonCore>(in_stack_00000f50,in_stack_00000f48);
  }
  else if (CVar1 - TOML_STRING < 2) {
    fileops::makeConnectionsToml<helics::CommonCore>(in_stack_000011a0,in_stack_00001198);
  }
  return;
}

Assistant:

void CommonCore::makeConnections(const std::string& file)
{
    auto type = fileops::getConfigType(file);

    switch (type) {
        case fileops::ConfigType::JSON_FILE:
        case fileops::ConfigType::JSON_STRING:
            fileops::makeConnectionsJson(this, file);
            break;
        case fileops::ConfigType::TOML_FILE:
        case fileops::ConfigType::TOML_STRING:
            fileops::makeConnectionsToml(this, file);
            break;
        case fileops::ConfigType::CMD_LINE:
        case fileops::ConfigType::NONE:
            // with NONE there are default command line and environment possibilities
            break;
    }
}